

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStreamTest.hpp
# Opt level: O1

void Qentem::Test::TestStringStream1(QTest *test)

{
  SizeT SVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  StringStream<char> ss1;
  String<char> n_str;
  SimpleStream sis;
  String<char> str;
  char *ss2_p;
  SizeT lss;
  StringStream<char> local_b8;
  StringStream<char> local_a8;
  String<char> local_98;
  StringStream<char> local_88;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined4 local_68;
  uint uStack_64;
  String<char> local_58;
  char *local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_a8.storage_ = (char *)0x0;
  local_a8.length_ = 0;
  local_a8.capacity_ = 0;
  local_b8.storage_ = (char *)0x0;
  local_b8.length_ = 0;
  local_b8.capacity_ = 0;
  StringStream<char>::allocate(&local_b8,10);
  local_58.storage_ = (char *)0x0;
  local_58.length_ = 0;
  local_88.storage_._0_4_ = local_a8.length_;
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x25);
  local_88.storage_._0_4_ = local_a8.capacity_;
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x26);
  QTest::IsNull(test,local_a8.storage_,0x27);
  pcVar5 = local_a8.storage_ + (local_a8.length_ - 1);
  if (local_a8.length_ == 0) {
    pcVar5 = (char *)0x0;
  }
  QTest::IsNull(test,pcVar5,0x28);
  local_88.storage_._0_4_ = local_b8.capacity_;
  local_98.storage_._0_4_ = 0x10;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x2a);
  local_88.storage_._0_4_ = local_b8.length_;
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x2b);
  QTest::IsNotNull(test,local_b8.storage_,0x2c);
  StringStream<char>::Reset(&local_b8);
  local_88.storage_._0_4_ = local_b8.length_;
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x2f);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_b8.capacity_);
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x30);
  QTest::IsNull(test,local_b8.storage_,0x31);
  local_88.storage_ = (char *)0x0;
  local_88.length_ = 0;
  local_88.capacity_ = 0;
  StringStream<char>::allocate(&local_88,1);
  StringStream<char>::operator=(&local_a8,&local_88);
  pcVar5 = local_88.storage_;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  SVar1 = local_a8.length_ + 1;
  if (local_a8.capacity_ == local_a8.length_) {
    StringStream<char>::expand(&local_a8,SVar1);
  }
  local_a8.storage_[local_a8._8_8_ & 0xffffffff] = 'a';
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,SVar1);
  local_98.storage_._0_4_ = 1;
  local_a8.length_ = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x35);
  QTest::IsTrue(test,local_a8.capacity_ != 0,0x36);
  QTest::IsNotNull(test,local_a8.storage_,0x37);
  pcVar5 = (char *)0x0;
  if (local_a8.length_ != 0) {
    pcVar5 = local_a8.storage_ + (local_a8.length_ - 1);
  }
  QTest::IsNotNull(test,pcVar5,0x38);
  local_88.storage_ = (char *)CONCAT71(local_88.storage_._1_7_,0x61);
  QTest::IsEqual<char,char>(test,local_a8.storage_,(char *)&local_88,0x39);
  StringStream<char>::GetString(&local_88);
  QTest::IsEqual<Qentem::String<char>,char[2]>
            (test,(String<char> *)&local_88,(char (*) [2])0x107189,0x3a);
  pcVar5 = local_88.storage_;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  local_88.storage_._0_4_ = local_a8.length_;
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x3b);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_a8.capacity_);
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x3c);
  QTest::IsNull(test,local_a8.storage_,0x3d);
  String<char>::String((String<char> *)&local_88,"a");
  pcVar5 = local_88.storage_;
  SVar1 = local_88.length_;
  uVar4 = local_b8.length_ + local_88.length_;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),pcVar5,SVar1);
  pcVar5 = local_88.storage_;
  local_b8.length_ = uVar4;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_b8.length_);
  local_98.storage_._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x40);
  QTest::IsTrue(test,local_b8.capacity_ != 0,0x41);
  StringStream<char>::GetString(&local_88);
  QTest::IsEqual<Qentem::String<char>,char[2]>
            (test,(String<char> *)&local_88,(char (*) [2])0x107189,0x42);
  pcVar5 = local_88.storage_;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  StringStream<char>::GetString(&local_88);
  QTest::IsNotEqual<Qentem::String<char>,char[3]>
            (test,(String<char> *)&local_88,(char (*) [3])"aa",0x43);
  pcVar5 = local_88.storage_;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  String<char>::String((String<char> *)&local_88,"a");
  pcVar5 = local_58.storage_;
  if (local_58.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(pcVar5);
  local_58.storage_ = local_88.storage_;
  local_58.length_ = local_88.length_;
  local_88.storage_ = (char *)0x0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  operator_delete((void *)0x0);
  SVar1 = local_58.length_;
  pcVar5 = local_58.storage_;
  uVar4 = local_b8.length_ + local_58.length_;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,pcVar5,SVar1);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,uVar4);
  local_98.storage_._0_4_ = 1;
  local_b8.length_ = uVar4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x47);
  QTest::IsTrue(test,local_b8.capacity_ != 0,0x48);
  QTest::IsEqual<Qentem::StringStream<char>,char[2]>(test,&local_b8,(char (*) [2])0x107189,0x49);
  QTest::IsNotEqual<Qentem::StringStream<char>,char[3]>(test,&local_b8,(char (*) [3])"aa",0x4a);
  StringStream<char>::Reset(&local_b8);
  uVar4 = local_b8.length_ + 3;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,"abc",3);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,uVar4);
  local_98.storage_._0_4_ = 3;
  local_b8.length_ = uVar4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x4f);
  QTest::IsTrue(test,2 < local_b8.capacity_,0x50);
  StringStream<char>::GetString(&local_88);
  QTest::IsEqual<Qentem::String<char>,char[4]>
            (test,(String<char> *)&local_88,(char (*) [4])"abc",0x51);
  pcVar5 = local_88.storage_;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  String<char>::String((String<char> *)&local_88,"abc");
  pcVar5 = local_88.storage_;
  SVar1 = local_88.length_;
  uVar4 = local_b8.length_ + local_88.length_;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,pcVar5,SVar1);
  pcVar5 = local_88.storage_;
  local_b8.length_ = uVar4;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_b8.length_);
  local_98.storage_._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x55);
  QTest::IsTrue(test,2 < local_b8.capacity_,0x56);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&local_b8,(char (*) [4])"abc",0x57);
  StringStream<char>::Reset(&local_b8);
  String<char>::String((String<char> *)&local_88,"abc");
  pcVar5 = local_58.storage_;
  if (local_58.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(pcVar5);
  local_58.storage_ = local_88.storage_;
  local_58.length_ = local_88.length_;
  local_88.storage_ = (char *)0x0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  operator_delete((void *)0x0);
  SVar1 = local_58.length_;
  pcVar5 = local_58.storage_;
  uVar4 = local_b8.length_ + local_58.length_;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,pcVar5,SVar1);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,uVar4);
  local_98.storage_._0_4_ = 3;
  local_b8.length_ = uVar4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x5c);
  QTest::IsTrue(test,2 < local_b8.capacity_,0x5d);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&local_b8,(char (*) [4])"abc",0x5e);
  StringStream<char>::Reset(&local_b8);
  String<char>::String((String<char> *)&local_88,"abc");
  pcVar5 = local_88.storage_;
  SVar1 = local_88.length_;
  uVar4 = local_b8.length_ + local_88.length_;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,pcVar5,SVar1);
  pcVar5 = local_88.storage_;
  local_b8.length_ = uVar4;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  StringStream<char>::operator=(&local_a8,&local_b8);
  local_88.storage_._0_4_ = local_a8.length_;
  local_98.storage_._0_4_ = local_b8.length_;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,99);
  QTest::IsTrue(test,local_b8.length_ <= local_a8.capacity_,100);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&local_a8,(char (*) [4])"abc",0x65);
  StringStream<char>::Reset(&local_a8);
  local_34 = local_a8.capacity_;
  local_a8.length_ = 0;
  local_88.storage_._0_4_ = 0;
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x6b);
  local_88.storage_._0_4_ = local_a8.capacity_;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,&local_34,0x6c);
  StringStream<char>::Reset(&local_a8);
  StringStream<char>::operator=(&local_a8,&local_b8);
  local_88.storage_._0_4_ = local_a8.length_;
  local_98.storage_._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x70);
  QTest::IsTrue(test,2 < local_a8.capacity_,0x71);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&local_a8,(char (*) [4])"abc",0x72);
  QTest::IsNull(test,local_b8.storage_,0x73);
  local_88.storage_._0_4_ = local_b8.length_;
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x74);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_b8.capacity_);
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x75);
  QTest::IsNull(test,local_b8.storage_,0x76);
  SVar1 = local_b8.length_ + 1;
  if (local_b8.capacity_ == local_b8.length_) {
    StringStream<char>::expand(&local_b8,SVar1);
  }
  local_b8.storage_[local_b8.length_] = 'a';
  local_b8.length_ = SVar1;
  StringStream<char>::Reset(&local_a8);
  StringStream<char>::operator=(&local_a8,&local_b8);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_a8.length_);
  local_98.storage_._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x7b);
  QTest::IsTrue(test,3 < local_a8.capacity_,0x7c);
  QTest::IsEqual<Qentem::StringStream<char>,char[2]>(test,&local_a8,(char (*) [2])0x107189,0x7d);
  StringStream<char>::Reset(&local_a8);
  uVar4 = local_a8.length_ + 3;
  if (local_a8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_a8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_a8.storage_ + local_a8.length_,"abc",3);
  local_a8.length_ = uVar4;
  StringStream<char>::StringStream(&local_88,&local_a8);
  StringStream<char>::operator=(&local_b8,&local_88);
  pcVar5 = local_88.storage_;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  local_88.storage_._0_4_ = local_a8.length_;
  local_98.storage_._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x82);
  QTest::IsTrue(test,2 < local_a8.capacity_,0x83);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&local_a8,(char (*) [4])"abc",0x84);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_b8.length_);
  local_98.storage_._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x85);
  QTest::IsTrue(test,2 < local_b8.capacity_,0x86);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&local_b8,(char (*) [4])"abc",0x87);
  StringStream<char>::Reset(&local_a8);
  StringStream<char>::Reset(&local_b8);
  uVar4 = local_a8.length_ + 3;
  if (local_a8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_a8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_a8.storage_ + (local_a8._8_8_ & 0xffffffff),"efg",3);
  local_88.storage_ = local_a8.storage_;
  local_88._8_8_ = CONCAT44(local_a8.capacity_,uVar4);
  local_a8.storage_ = (char *)0x0;
  local_a8.length_ = 0;
  local_a8.capacity_ = 0;
  StringStream<char>::operator=(&local_b8,&local_88);
  pcVar5 = local_88.storage_;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar5);
  QTest::IsNull(test,local_a8.storage_,0x8d);
  local_88.storage_._0_4_ = local_a8.length_;
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x8e);
  QTest::IsTrue(test,local_a8.capacity_ == 0,0x8f);
  QTest::IsNull(test,local_a8.storage_,0x90);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&local_b8,(char (*) [4])"efg",0x91);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_b8.length_);
  local_98.storage_._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x92);
  QTest::IsTrue(test,2 < local_b8.capacity_,0x93);
  local_88.storage_ = (char *)CONCAT71(local_88.storage_._1_7_,0x67);
  QTest::IsEqual<char,char>(test,local_b8.storage_ + 2,(char *)&local_88,0x94);
  StringStream<char>::Reset(&local_b8);
  uVar4 = local_b8.length_ + 1;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"a",1);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,uVar4);
  local_98.storage_._0_4_ = 1;
  local_b8.length_ = uVar4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x98);
  QTest::IsTrue(test,local_b8.capacity_ != 0,0x99);
  QTest::IsTrue(test,local_b8.capacity_ != 0,0x9a);
  QTest::IsNotNull(test,local_b8.storage_,0x9b);
  local_88.storage_ = (char *)CONCAT71(local_88.storage_._1_7_,0x61);
  QTest::IsEqual<char,char>(test,local_b8.storage_,(char *)&local_88,0x9c);
  uVar4 = local_b8.length_ + 2;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,"bc",2);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,uVar4);
  local_98.storage_._0_4_ = 3;
  local_b8.length_ = uVar4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0x9f);
  QTest::IsTrue(test,2 < local_b8.capacity_,0xa0);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&local_b8,(char (*) [4])"abc",0xa1);
  StringStream<char>::Reset(&local_b8);
  SVar1 = local_b8.length_;
  uVar4 = local_b8.length_ + 1;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,"abcdef",1);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 2;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"bcdef",1);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 3;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"cdef",1);
  pcVar5 = local_b8.storage_;
  local_b8.storage_ = (char *)0x0;
  local_b8.length_ = 0;
  local_b8.capacity_ = 0;
  lVar6 = 0;
  do {
    if (pcVar5[lVar6] != "abc"[lVar6]) goto LAB_001021ee;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 3;
LAB_001021ee:
  if (pcVar5 != (char *)0x0) {
    MemoryRecord::RemoveAllocation(pcVar5);
  }
  operator_delete(pcVar5);
  QTest::IsTrue(test,(int)lVar6 == 3,0xac);
  SVar1 = local_b8.length_;
  uVar4 = local_b8.length_ + 6;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"abcdef",6);
  uVar7 = SVar1 - 4;
  if (uVar4 < 10) {
    uVar7 = uVar4;
  }
  local_98.storage_._0_4_ = 6;
  local_b8.length_ = uVar7;
  local_88.storage_._0_4_ = uVar7;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xb0);
  if (local_b8.length_ != 0) {
    local_b8.length_ = local_b8.length_ - 1;
  }
  local_88.storage_._0_4_ = local_b8.length_;
  local_98.storage_._0_4_ = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xb3);
  if (1 < local_b8.length_) {
    local_b8.length_ = local_b8.length_ - 2;
  }
  local_88.storage_._0_4_ = local_b8.length_;
  local_98.storage_._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xb6);
  if (2 < local_b8.length_) {
    local_b8.length_ = local_b8.length_ - 3;
  }
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_b8.length_);
  local_98.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xb9);
  SVar1 = local_b8.length_;
  uVar4 = local_b8.length_ + 9;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x12;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x1b;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x24;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x2d;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x36;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x3f;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x48;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x51;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x5a;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 99;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x6c;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_b8.length_ = uVar4;
  uVar4 = SVar1 + 0x75;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"123456789",9);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,uVar4);
  local_98.storage_._0_4_ = 0x75;
  local_b8.length_ = uVar4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xc9);
  QTest::IsTrue(test,0x74 < local_b8.capacity_,0xca);
  QTest::IsEqual<Qentem::StringStream<char>,char[118]>
            (test,&local_b8,
             (char (*) [118])
             "123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789"
             ,0xce);
  StringStream<char>::Reset(&local_a8);
  StringStream<char>::Reset(&local_b8);
  if (local_a8.capacity_ < 2) {
    StringStream<char>::expand(&local_a8,2);
  }
  local_a8.length_ = 2;
  local_88.storage_._0_4_ = 2;
  local_98.storage_._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xd4);
  local_a8.storage_[0] = 'a';
  local_a8.storage_[1] = 'b';
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_a8.length_);
  local_98.storage_._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xdc);
  lVar6 = 0;
  do {
    if (local_a8.storage_[lVar6] != "ab"[lVar6]) goto LAB_00102698;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  lVar6 = 2;
LAB_00102698:
  QTest::IsTrue(test,(int)lVar6 == 2,0xdd);
  uVar4 = local_a8.length_ + 1;
  if (local_a8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_a8,uVar4);
  }
  pcVar5 = local_a8.storage_;
  uVar3 = (ulong)local_a8.length_;
  local_a8.length_ = uVar4;
  local_98.storage_._0_4_ = 3;
  local_88.storage_._0_4_ = uVar4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xe0);
  pcVar5[uVar3] = 'c';
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_a8.length_);
  local_98.storage_._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xe4);
  lVar6 = 0;
  do {
    if (local_a8.storage_[lVar6] != "abc"[lVar6]) goto LAB_00102749;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 3;
LAB_00102749:
  QTest::IsTrue(test,(int)lVar6 == 3,0xe5);
  SVar1 = local_b8.capacity_;
  local_b8._8_8_ = (ulong)local_b8.capacity_ << 0x20;
  if (SVar1 < 2) {
    StringStream<char>::expand(&local_b8,2);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),"ab",2);
  local_b8.length_ = 2;
  if ((local_a8._8_8_ & 0xffffffff) == 2) {
    lVar6 = 0;
    do {
      if (local_a8.storage_[lVar6] != local_b8.storage_[lVar6]) goto LAB_001027c5;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    lVar6 = 2;
LAB_001027c5:
    bVar8 = (SizeT)lVar6 == local_a8.length_;
  }
  else {
    bVar8 = false;
  }
  local_88.storage_ = (char *)CONCAT71(local_88.storage_._1_7_,bVar8);
  local_98.storage_._0_4_ = (uint)local_98.storage_ & 0xffffff00;
  QTest::IsEqual<bool,bool>(test,(bool *)&local_88,(bool *)&local_98,0xe9);
  uVar4 = local_a8.length_ + 2;
  if (local_a8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_a8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_a8.storage_ + (local_a8._8_8_ & 0xffffffff),"de",2);
  local_a8.length_ = uVar4;
  local_98.storage_._0_4_ = 5;
  local_88.storage_._0_4_ = uVar4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xec);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,&local_a8,(char (*) [6])"abcde",0xed);
  StringStream<char>::operator=(&local_b8,&local_a8);
  local_88.storage_ = (char *)CONCAT44(local_88.storage_._4_4_,local_b8.length_);
  local_98.storage_._0_4_ = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)&local_98,0xf0);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,&local_b8,(char (*) [6])"abcde",0xf1);
  StringStream<char>::Reset(&local_b8);
  uVar4 = local_b8.length_ + 0x24;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>
            (local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),
             "123456789123456789123456789123456789",0x24);
  local_b8.length_ = uVar4;
  local_48 = local_b8.storage_;
  StringStream<char>::GetString(&local_88);
  pcVar5 = local_58.storage_;
  if (local_58.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(pcVar5);
  local_58.storage_ = local_88.storage_;
  local_58.length_ = local_88.length_;
  local_88.storage_ = (char *)0x0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  operator_delete((void *)0x0);
  local_88.storage_ = local_58.storage_;
  QTest::IsEqual<char_const*,char_const*>(test,&local_48,&local_88.storage_,0xf9);
  QTest::IsEqual<Qentem::String<char>,char[37]>(test,&local_58,(char (*) [37])0x1071eb,0xfa);
  StringStream<char>::Reset(&local_b8);
  StringStream<char>::operator=(&local_a8,"abcdefgh");
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&local_a8,(char (*) [9])"abcdefgh",0x101);
  pcVar5 = local_a8.storage_;
  SVar1 = local_a8.length_;
  uVar4 = local_b8.length_ + local_a8.length_;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),pcVar5,SVar1);
  local_b8.length_ = uVar4;
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&local_a8,(char (*) [9])"abcdefgh",0x104);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&local_b8,(char (*) [9])"abcdefgh",0x105);
  String<char>::String(&local_98,"12345678");
  StringStream<char>::operator=(&local_a8,&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&local_a8,(char (*) [9])0x10723a,0x109);
  StringStream<char>::Reset(&local_b8);
  SVar1 = local_98.length_;
  pvVar2 = (void *)CONCAT44(local_98.storage_._4_4_,(uint)local_98.storage_);
  uVar4 = local_b8.length_ + local_98.length_;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,pvVar2,SVar1);
  local_b8.length_ = uVar4;
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&local_b8,(char (*) [9])0x10723a,0x10e);
  local_88.storage_ = (char *)0x0;
  local_88.length_ = 0;
  local_88.capacity_ = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  local_68 = 0x20;
  uStack_64 = 0;
  if ((local_b8._8_8_ & 0xffffffff) != 0) {
    uVar3 = 0;
    do {
      *(char *)((long)&local_88.storage_ + (ulong)uStack_64) = local_b8.storage_[uVar3];
      uStack_64 = uStack_64 + 1;
      uVar3 = uVar3 + 1;
    } while ((local_b8._8_8_ & 0xffffffff) != uVar3);
  }
  lVar6 = 0;
  do {
    if (*(char *)((long)&local_88.storage_ + lVar6) !=
        "12345678123456781234567812345678"[lVar6 + 0x18]) goto LAB_00102b03;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  lVar6 = 8;
LAB_00102b03:
  QTest::IsTrue(test,(int)lVar6 == 8,0x11d);
  pvVar2 = (void *)CONCAT44(local_98.storage_._4_4_,(uint)local_98.storage_);
  uVar4 = local_b8.length_ + local_98.length_;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>
            (local_b8.storage_ + (local_b8._8_8_ & 0xffffffff),pvVar2,local_98.length_);
  local_b8.length_ = uVar4;
  QTest::IsEqual<Qentem::StringStream<char>,char[17]>(test,&local_b8,(char (*) [17])0x107232,0x120);
  local_38 = local_b8.capacity_;
  local_3c = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_38,&local_3c,0x121);
  uVar4 = local_b8.length_ + 0x10;
  if (local_b8.capacity_ < uVar4) {
    StringStream<char>::expand(&local_b8,uVar4);
  }
  Memory::Copy<unsigned_int>(local_b8.storage_ + local_b8.length_,"1234567812345678",0x10);
  uStack_64 = 0;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      *(char *)((long)&local_88.storage_ + (ulong)uStack_64) = local_b8.storage_[uVar3];
      uStack_64 = uStack_64 + 1;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  lVar6 = 0;
  do {
    if (*(char *)((long)&local_88.storage_ + lVar6) != "12345678123456781234567812345678"[lVar6])
    goto LAB_00102c14;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  lVar6 = 0x20;
LAB_00102c14:
  local_b8.length_ = uVar4;
  QTest::IsTrue(test,(int)lVar6 == 0x20,0x127);
  if (local_b8.length_ != 0) {
    local_b8.length_ = local_b8.length_ - 1;
  }
  uStack_64 = 0;
  if ((ulong)local_b8.length_ != 0) {
    uVar3 = 0;
    do {
      *(char *)((long)&local_88.storage_ + (ulong)uStack_64) = local_b8.storage_[uVar3];
      uStack_64 = uStack_64 + 1;
      uVar3 = uVar3 + 1;
    } while (local_b8.length_ != uVar3);
  }
  lVar6 = 0;
  do {
    if (*(char *)((long)&local_88.storage_ + lVar6) != "1234567"[lVar6]) goto LAB_00102c88;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  lVar6 = 7;
LAB_00102c88:
  QTest::IsTrue(test,(int)lVar6 == 7,300);
  pvVar2 = (void *)CONCAT44(local_98.storage_._4_4_,(uint)local_98.storage_);
  if (pvVar2 != (void *)0x0) {
    MemoryRecord::RemoveAllocation(pvVar2);
  }
  operator_delete(pvVar2);
  operator_delete((void *)0x0);
  pcVar5 = local_58.storage_;
  if (local_58.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(pcVar5);
  pcVar5 = local_b8.storage_;
  if (local_b8.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_b8.storage_);
  }
  operator_delete(pcVar5);
  pcVar5 = local_a8.storage_;
  if (local_a8.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_a8.storage_);
  }
  operator_delete(pcVar5);
  return;
}

Assistant:

static void TestStringStream1(QTest &test) {
    StringStream<char> ss1;
    StringStream<char> ss2{10}; // Preset size
    String<char>       str;

    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss1.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss1.First(), __LINE__);
    test.IsNull(ss1.Last(), __LINE__);

    test.IsEqual(ss2.Capacity(), SizeT{16}, __LINE__);
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);
    test.IsNotNull(ss2.First(), __LINE__);

    ss2.Reset();
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss2.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss2.First(), __LINE__);

    ss1 = StringStream<char>(1);
    ss1 += 'a';
    test.IsEqual(ss1.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{1}), __LINE__);
    test.IsNotNull(ss1.First(), __LINE__);
    test.IsNotNull(ss1.Last(), __LINE__);
    test.IsEqual(ss1.First()[0], 'a', __LINE__);
    test.IsEqual(ss1.GetString(), "a", __LINE__);
    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss1.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss1.First(), __LINE__);

    ss2 += String<char>("a");
    test.IsEqual(ss2.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsEqual(ss2.GetString(), "a", __LINE__);
    test.IsNotEqual(ss2.GetString(), "aa", __LINE__);

    str = String<char>("a");
    ss2 += str;
    test.IsEqual(ss2.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsEqual(ss2, "a", __LINE__);
    test.IsNotEqual(ss2, "aa", __LINE__);

    ss2.Reset();

    ss2 += "abc";
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2.GetString(), "abc", __LINE__);
    const String<char> sss;

    ss2 += String<char>("abc");
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss2.Reset();

    str = String<char>("abc");
    ss2 += str;
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss2.Reset();

    ss2 += String<char>("abc");
    ss1 = ss2; // Copy
    test.IsEqual(ss1.Length(), ss2.Length(), __LINE__);
    test.IsTrue((ss1.Capacity() >= ss2.Length()), __LINE__);
    test.IsEqual(ss1, "abc", __LINE__);
    ss1.Reset();

    const SizeT lss = ss1.Capacity();

    ss1.Clear();
    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss1.Capacity(), lss, __LINE__);

    ss1.Reset();
    ss1 = Memory::Move(ss2); // Move
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss1, "abc", __LINE__);
    test.IsNull(ss2.Storage(), __LINE__);
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss2.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss2.First(), __LINE__);

    ss2 += 'a';
    ss1.Reset();
    ss1 = Memory::Move(ss2); // Move
    test.IsEqual(ss1.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{4}), __LINE__);
    test.IsEqual(ss1, "a", __LINE__);
    ss1.Reset();

    ss1 += "abc";
    ss2 = StringStream<char>(ss1); // Copy
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss1, "abc", __LINE__);
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss1.Reset();
    ss2.Reset();

    ss1 += "efg";
    ss2 = StringStream<char>(Memory::Move(ss1)); // Move
    test.IsNull(ss1.Storage(), __LINE__);
    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsTrue((ss1.Capacity() == SizeT{0}), __LINE__);
    test.IsNull(ss1.First(), __LINE__);
    test.IsEqual(ss2, "efg", __LINE__);
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2.First()[2], 'g', __LINE__);

    ss2.Reset();
    ss2.Write("a", SizeT{1});
    test.IsEqual(ss2.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsNotNull(ss2.First(), __LINE__);
    test.IsEqual(ss2.First()[0], 'a', __LINE__);

    ss2.Write("bc", SizeT{2});
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss2.Reset();

    ss2.Write("abcdef", SizeT{1});
    ss2.Write("bcdef", SizeT{1});
    ss2.Write("cdef", SizeT{1});

    char      *e_str    = ss2.Detach();
    const bool is_equal = StringUtils::IsEqual(e_str, "abc", SizeT{3});
    Memory::Deallocate(e_str);

    test.IsTrue(is_equal, __LINE__);

    ss2 += "abcdef";
    ss2.StepBack(10);
    test.IsEqual(ss2.Length(), SizeT{6}, __LINE__);

    ss2.StepBack(1);
    test.IsEqual(ss2.Length(), SizeT{5}, __LINE__);

    ss2.StepBack(2);
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);

    ss2.StepBack(3);
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);

    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";

    test.IsEqual(ss2.Length(), SizeT{117}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{117}), __LINE__);
    test.IsEqual(
        ss2,
        "123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789",
        __LINE__);

    ss1.Reset();
    ss2.Reset();

    ss1.SetLength(2);
    test.IsEqual(ss1.Length(), SizeT{2}, __LINE__);

    char *buffer = ss1.Storage();
    buffer[0]    = 'a';
    buffer[1]    = 'b';

    const char *ab = "ab";

    test.IsEqual(ss1.Length(), SizeT{2}, __LINE__);
    test.IsTrue(StringUtils::IsEqual(ss1.First(), ab, SizeT{2}), __LINE__);

    buffer = ss1.Buffer(1);
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);

    buffer[0]       = 'c';
    const char *ab2 = "abc";
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);
    test.IsTrue(StringUtils::IsEqual(ss1.First(), ab2, SizeT{3}), __LINE__);

    ss2.Clear();
    ss2 += "ab";
    test.IsEqual((ss1 == ss2), false, __LINE__);

    ss1 += "de";
    test.IsEqual(ss1.Length(), SizeT{5}, __LINE__);
    test.IsEqual(ss1, "abcde", __LINE__);

    ss2 = ss1;
    test.IsEqual(ss2.Length(), SizeT{5}, __LINE__);
    test.IsEqual(ss2, "abcde", __LINE__);

    ss2.Reset();

    /////////
    ss2 += "123456789123456789123456789123456789";
    const char *ss2_p = ss2.First();
    str               = ss2.GetString();
    test.IsEqual(ss2_p, str.First(), __LINE__);
    test.IsEqual(str, "123456789123456789123456789123456789", __LINE__);

    /////////

    ss2.Reset();

    ss1 = "abcdefgh";
    test.IsEqual(ss1, "abcdefgh", __LINE__);

    ss2 << ss1;
    test.IsEqual(ss1, "abcdefgh", __LINE__);
    test.IsEqual(ss2, "abcdefgh", __LINE__);

    const String<char> n_str = String<char>("12345678");
    ss1                      = n_str;
    test.IsEqual(ss1, "12345678", __LINE__);

    ss2.Reset();

    ss2 << n_str;
    test.IsEqual(ss2, "12345678", __LINE__);

    struct SimpleStream {
        char          str[32]{0};
        const SizeT32 max = 32U;
        SizeT32       index{0};

        void operator<<(const char ch) noexcept {
            str[index] = ch;
            ++index;
        }
    };

    SimpleStream sis;
    sis << ss2;
    test.IsTrue(StringUtils::IsEqual(&(sis.str[0]), "12345678", SizeT{8}), __LINE__);

    ss2 << n_str;
    test.IsEqual(ss2, "1234567812345678", __LINE__);
    test.IsEqual(ss2.Capacity(), SizeT{32}, __LINE__);

    ss2 << "1234567812345678";
    sis.index = SizeT{0};
    sis << ss2;

    test.IsTrue(StringUtils::IsEqual(&(sis.str[0]), "12345678123456781234567812345678", SizeT{32}), __LINE__);

    ss2.StepBack(1);
    sis.index = SizeT{0};
    sis << ss2;
    test.IsTrue(StringUtils::IsEqual(&(sis.str[0]), "1234567", SizeT{7}), __LINE__);
}